

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O3

int __thiscall Board::get_result(Board *this,int player_number)

{
  mapped_type *pmVar1;
  int iVar2;
  uint i;
  int iVar3;
  undefined8 local_28;
  
  local_28 = (ulong)(uint)player_number << 0x20;
  iVar2 = 0x7fffffff;
  iVar3 = 1;
  do {
    local_28 = CONCAT44(local_28._4_4_,iVar3);
    pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](&this->m_player_scores,(key_type *)&local_28);
    if (*pmVar1 < iVar2) {
      iVar2 = *pmVar1;
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 5);
  pmVar1 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&this->m_player_scores,(key_type *)((long)&local_28 + 4));
  return (int)(iVar2 == *pmVar1);
}

Assistant:

int Board::get_result(int player_number) // TODO implement draw - 2 people have same score
{
    int lowest_score = INT32_MAX;

    for (unsigned int i(1); i < 5; ++i) {
        int current_score = m_player_scores[i];
        if(current_score < lowest_score) {
            lowest_score = current_score;
        }
    }

    if(lowest_score == m_player_scores[player_number]) {
        return 1;
    }
    return 0;
}